

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,float kappa,float delta,float theta)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  _Head_base<0UL,_int_*,_false> _Var9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  row_iterator prVar14;
  long lVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_register_000012c4 [12];
  undefined1 local_90 [20];
  float local_7c;
  long local_78;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_70;
  _Head_base<0UL,_int_*,_false> local_68;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_60;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_58;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_50;
  unique_ptr<baryonyx::sparse_matrix<int>::row_value[],_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_48;
  ulong local_40;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_38;
  
  local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 8);
  fVar16 = kappa / (1.0 - kappa);
  local_7c = theta;
  local_50._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )last._M_current;
  do {
    if ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
         )first._M_current ==
        (_Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
         )local_50._M_t.
          super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl) {
      return false;
    }
    lVar13 = (long)((row_value *)first._M_current)->value;
    if (*(int *)(this + 0x80) <= ((row_value *)first._M_current)->value) {
      details::fail_fast("Precondition","k < m",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"186");
    }
    iVar11 = (int)local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                  super__Head_base<0UL,_int_*,_false>._M_head_impl;
    local_48._M_t.
    super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (__uniq_ptr_data<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>,_true,_true>
          )(__uniq_ptr_data<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>,_true,_true>
            )first._M_current;
    sparse_matrix<int>::row((sparse_matrix<int> *)local_90,iVar11);
    solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
    ::decrease_preference
              ((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                *)this,(row_iterator)local_90._8_8_,(row_iterator)local_90._0_8_,local_7c);
    uVar12 = 0;
    for (_Var9._M_head_impl = (int *)local_90._8_8_; _Var9._M_head_impl != (int *)local_90._0_8_;
        _Var9._M_head_impl = _Var9._M_head_impl + 2) {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_68,iVar11);
      lVar6 = *(long *)(this + 0x48);
      auVar17 = ZEXT816(0) << 0x40;
      while (local_60._M_t.
             super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
             .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl
             != (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                 )local_68._M_head_impl) {
        iVar2 = *(int *)local_60._M_t.
                        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                        _M_head_impl;
        local_60._M_t.
        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
             (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
              )((long)local_60._M_t.
                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                      _M_head_impl + 8);
        auVar18._0_4_ = (float)*(int *)(lVar6 + (long)iVar2 * 4);
        auVar18._4_12_ = in_register_000012c4;
        auVar17 = vfmadd231ss_fma(auVar17,auVar18,
                                  ZEXT416(*(uint *)(*(long *)(this + 0x68) + (long)iVar2 * 4)));
      }
      lVar15 = *(long *)(this + 0x50);
      lVar8 = uVar12 * 0xc;
      *(int *)(lVar15 + 4 + lVar8) = (int)uVar12;
      uVar12 = uVar12 + 1;
      *(undefined4 *)(lVar15 + 8 + lVar8) = *(undefined4 *)(lVar6 + (long)*_Var9._M_head_impl * 4);
      *(float *)(lVar15 + lVar8) =
           *(float *)(*(long *)(*(long *)(this + 0x70) + 8) + (long)*(int *)(local_90._8_8_ + 4) * 4
                     ) - auVar17._0_4_;
    }
    calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>::rc_data*>
              (*(rc_data **)(this + 0x50),*(rc_data **)(this + 0x50) + (uVar12 & 0xffffffff),
               *(random_engine **)this);
    lVar6 = *(long *)(this + 0x58);
    local_70._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )(lVar13 * 0xc);
    local_78 = lVar13;
    local_40 = uVar12;
    if (*(int *)(lVar6 + (long)local_70._M_t.
                               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                               .
                               super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                               ._M_head_impl) < 1) {
      iVar11 = 0;
      uVar12 = 0xffffffffffffffff;
LAB_0014c690:
      bVar5 = iVar11 <= *(int *)(lVar6 + 4 +
                                (long)local_70._M_t.
                                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                      .
                                      super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                      ._M_head_impl);
    }
    else {
      lVar15 = -0x100000000;
      lVar8 = 0;
      local_38._M_head_impl = (col_value *)(long)((int)uVar12 + -2);
      lVar13 = *(long *)(this + 0x50);
      iVar11 = 0;
      lVar6 = -1;
      do {
        uVar4 = local_90._8_8_;
        iVar11 = iVar11 + *(int *)(lVar13 + 8 + lVar8);
        lVar15 = lVar15 + 0x100000000;
        iVar2 = *(int *)(lVar13 + 4 + lVar8);
        iVar3 = *(int *)(*(long *)(this + 0x58) +
                        (long)local_70._M_t.
                              super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                              ._M_head_impl);
        bit_array_impl::set(&x->super_bit_array_impl,
                            ((row_iterator)(local_90._8_8_ + (long)iVar2 * 8))->column);
        lVar13 = *(long *)(this + 0x50);
        auVar17 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(lVar13 + lVar8) * 0.5)),
                                  ZEXT416((uint)fVar16),ZEXT416((uint)delta));
        *(float *)(*(long *)(this + 0x68) +
                  (long)((row_iterator)(uVar4 + (long)iVar2 * 8))->value * 4) =
             auVar17._0_4_ +
             *(float *)(*(long *)(this + 0x68) +
                       (long)((row_iterator)(uVar4 + (long)iVar2 * 8))->value * 4);
        if (iVar3 <= iVar11) break;
        lVar8 = lVar8 + 0xc;
        bVar5 = lVar6 < (long)local_38._M_head_impl;
        lVar6 = lVar6 + 1;
      } while (bVar5);
      lVar6 = *(long *)(this + 0x58);
      uVar12 = lVar15 >> 0x20;
      if (*(int *)(lVar6 + (long)local_70._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                 ._M_head_impl) <= iVar11) goto LAB_0014c690;
      bVar5 = false;
    }
    uVar7 = (ulong)(int)(size_type)local_40;
    lVar13 = uVar12 * 0xc;
    uVar10 = uVar12;
    while( true ) {
      lVar6 = local_78;
      uVar10 = uVar10 + 1;
      uVar12 = uVar12 + 1;
      if ((uVar7 <= uVar12) || (!bVar5)) break;
      lVar6 = *(long *)(this + 0x50);
      iVar11 = iVar11 + *(int *)(lVar6 + 0x14 + lVar13);
      if (iVar11 < *(int *)(*(long *)(this + 0x58) +
                           (long)local_70._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                 ._M_head_impl)) {
        prVar14 = (row_iterator)(local_90._8_8_ + (long)*(int *)(lVar6 + 0x10 + lVar13) * 8);
LAB_0014c753:
        bit_array_impl::unset(&x->super_bit_array_impl,prVar14->column);
        auVar17 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc + lVar13) *
                                                0.5)),ZEXT416((uint)fVar16),ZEXT416((uint)delta));
        *(float *)(*(long *)(this + 0x68) + (long)prVar14->value * 4) =
             *(float *)(*(long *)(this + 0x68) + (long)prVar14->value * 4) - auVar17._0_4_;
        bVar5 = false;
      }
      else {
        prVar14 = (row_iterator)(local_90._8_8_ + (long)*(int *)(lVar6 + 0x10 + lVar13) * 8);
        if ((*(int *)(*(long *)(this + 0x58) +
                      (long)local_70._M_t.
                            super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                            .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                            ._M_head_impl + 4) < iVar11) ||
           (bVar5 = stop_iterating<baryonyx::itm::minimize_tag,float>
                              (*(float *)(lVar6 + 0xc + lVar13),*(random_engine **)this), !bVar5))
        goto LAB_0014c753;
        bit_array_impl::set(&x->super_bit_array_impl,prVar14->column);
        auVar17 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc + lVar13) *
                                                0.5)),ZEXT416((uint)fVar16),ZEXT416((uint)delta));
        *(float *)(*(long *)(this + 0x68) + (long)prVar14->value * 4) =
             auVar17._0_4_ + *(float *)(*(long *)(this + 0x68) + (long)prVar14->value * 4);
        bVar5 = true;
      }
      lVar13 = lVar13 + 0xc;
    }
    while (uVar4 = local_90._8_8_, uVar10 < uVar7) {
      iVar11 = *(int *)(*(long *)(this + 0x50) + 0x10 + lVar13);
      bit_array_impl::unset
                (&x->super_bit_array_impl,
                 ((row_iterator)(local_90._8_8_ + (long)iVar11 * 8))->column);
      uVar10 = uVar10 + 1;
      pfVar1 = (float *)(*(long *)(this + 0x50) + 0xc + lVar13);
      lVar13 = lVar13 + 0xc;
      auVar17 = vfmadd213ss_fma(ZEXT416((uint)(*pfVar1 * 0.5)),ZEXT416((uint)fVar16),
                                ZEXT416((uint)delta));
      *(float *)(*(long *)(this + 0x68) +
                (long)((row_iterator)(uVar4 + (long)iVar11 * 8))->value * 4) =
           *(float *)(*(long *)(this + 0x68) +
                     (long)((row_iterator)(uVar4 + (long)iVar11 * 8))->value * 4) - auVar17._0_4_;
    }
    bVar5 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<float>>,baryonyx::bit_array>
                      ((solver_random_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<float>_>
                        *)this,(int)lVar6,x);
    if (!bVar5) {
      details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"335");
    }
    first._M_current =
         (pair<int,_int> *)
         ((long)local_48._M_t.
                super___uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                _M_head_impl + 8);
  } while( true );
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }